

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx512::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar7;
  undefined4 uVar8;
  ushort uVar9;
  ushort uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  byte bVar27;
  long lVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 (*pauVar39) [16];
  size_t sVar40;
  RayHitK<8> *pRVar41;
  byte bVar42;
  int iVar43;
  AABBNodeMB4D *node1;
  ulong uVar44;
  long lVar45;
  uint uVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  byte bVar52;
  uint uVar53;
  float fVar54;
  float fVar104;
  float fVar105;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  float fVar106;
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  vint4 ai;
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  vint4 ai_2;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar116;
  vint4 bi;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar122;
  vint4 ai_6;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 bi_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  vint4 bi_7;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [64];
  undefined1 auVar162 [64];
  undefined1 auVar163 [64];
  UVIdentity<8> mapUV;
  RTCFilterFunctionNArguments args;
  vint4 bi_3;
  vfloat<4> dist;
  vfloat<4> tNear;
  vint<8> itime;
  vfloat<8> ftime;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1499;
  undefined1 (*local_1498) [16];
  long local_1490;
  ulong local_1488;
  uint local_147c;
  uint local_1478;
  uint local_1474;
  ulong local_1470;
  ulong local_1468;
  int local_1460;
  int iStack_145c;
  int iStack_1458;
  int iStack_1454;
  long local_1448;
  ulong local_1440;
  ulong local_1438;
  ulong local_1430;
  ulong local_1428;
  ulong local_1420;
  ulong local_1418;
  long local_1410;
  ulong local_1408;
  size_t local_1400;
  RayHitK<8> *local_13f8;
  long local_13f0;
  long local_13e8;
  Scene *local_13e0;
  ulong local_13d8;
  RTCFilterFunctionNArguments local_13d0;
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [8];
  float fStack_1348;
  float fStack_1344;
  undefined1 local_1340 [8];
  float fStack_1338;
  float fStack_1334;
  int local_1330;
  int iStack_132c;
  int iStack_1328;
  int iStack_1324;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float local_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined1 local_1300 [32];
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined1 local_1270 [16];
  undefined1 local_1260 [32];
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined1 local_1220 [32];
  undefined1 *local_1200;
  uint local_11f8;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  float local_1180 [4];
  float fStack_1170;
  float fStack_116c;
  float fStack_1168;
  uint uStack_1164;
  undefined1 local_1160 [32];
  float local_1140 [4];
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  uint uStack_1124;
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  float fStack_10a4;
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_1498 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  local_1360 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar159 = ZEXT1664(local_1360);
  local_1370 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar160 = ZEXT1664(local_1370);
  local_1380 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar161 = ZEXT1664(local_1380);
  fVar122 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fStack_1304 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fStack_1314 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_1390 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar122 * 0.99999964)));
  auVar162 = ZEXT1664(local_1390);
  local_13a0 = vbroadcastss_avx512vl(ZEXT416((uint)(fStack_1304 * 0.99999964)));
  auVar163 = ZEXT1664(local_13a0);
  fVar116 = fStack_1314 * 0.99999964;
  local_1340._4_4_ = fVar116;
  local_1340._0_4_ = fVar116;
  fStack_1338 = fVar116;
  fStack_1334 = fVar116;
  auVar144 = ZEXT1664(_local_1340);
  fVar122 = fVar122 * 1.0000004;
  local_1350._4_4_ = fVar122;
  local_1350._0_4_ = fVar122;
  fStack_1348 = fVar122;
  fStack_1344 = fVar122;
  auVar140 = ZEXT1664(_local_1350);
  fStack_1304 = fStack_1304 * 1.0000004;
  fStack_1314 = fStack_1314 * 1.0000004;
  local_1418 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_1420 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1428 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_1430 = local_1418 ^ 0x10;
  local_1438 = local_1420 ^ 0x10;
  local_1440 = local_1428 ^ 0x10;
  iStack_1324 = (tray->tnear).field_0.i[k];
  iStack_1454 = (tray->tfar).field_0.i[k];
  local_1120 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  fStack_1308 = fStack_1304;
  fStack_130c = fStack_1304;
  local_1310 = fStack_1304;
  fStack_1318 = fStack_1314;
  fStack_131c = fStack_1314;
  local_1320 = fStack_1314;
  iStack_1328 = iStack_1324;
  iStack_132c = iStack_1324;
  local_1330 = iStack_1324;
  local_13f8 = ray;
  local_1400 = k;
  iStack_1458 = iStack_1454;
  iStack_145c = iStack_1454;
  local_1460 = iStack_1454;
  do {
    do {
      do {
        if (local_1498 == (undefined1 (*) [16])&local_fa0) {
          return;
        }
        pauVar39 = local_1498 + -1;
        local_1498 = local_1498 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)((long)*pauVar39 + 8));
      local_1470 = *(ulong *)*local_1498;
      do {
        if ((local_1470 & 8) == 0) {
          uVar44 = local_1470 & 0xfffffffffffffff0;
          uVar7 = *(undefined4 *)(ray + k * 4 + 0xe0);
          auVar66._4_4_ = uVar7;
          auVar66._0_4_ = uVar7;
          auVar66._8_4_ = uVar7;
          auVar66._12_4_ = uVar7;
          auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1418),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1418));
          auVar55 = vsubps_avx512vl(auVar57,auVar159._0_16_);
          auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1420),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1420));
          auVar56 = vmulps_avx512vl(auVar162._0_16_,auVar55);
          auVar55 = vsubps_avx512vl(auVar57,auVar160._0_16_);
          auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1428),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1428));
          auVar55 = vmulps_avx512vl(auVar163._0_16_,auVar55);
          auVar57 = vsubps_avx512vl(auVar57,auVar161._0_16_);
          auVar123._0_4_ = auVar144._0_4_ * auVar57._0_4_;
          auVar123._4_4_ = auVar144._4_4_ * auVar57._4_4_;
          auVar123._8_4_ = auVar144._8_4_ * auVar57._8_4_;
          auVar123._12_4_ = auVar144._12_4_ * auVar57._12_4_;
          auVar57 = vmaxps_avx(auVar55,auVar123);
          auVar55._4_4_ = iStack_132c;
          auVar55._0_4_ = local_1330;
          auVar55._8_4_ = iStack_1328;
          auVar55._12_4_ = iStack_1324;
          auVar55 = vmaxps_avx(auVar55,auVar56);
          auVar57 = vmaxps_avx(auVar55,auVar57);
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1430),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1430));
          auVar55 = vsubps_avx512vl(auVar55,auVar159._0_16_);
          auVar117._0_4_ = auVar140._0_4_ * auVar55._0_4_;
          auVar117._4_4_ = auVar140._4_4_ * auVar55._4_4_;
          auVar117._8_4_ = auVar140._8_4_ * auVar55._8_4_;
          auVar117._12_4_ = auVar140._12_4_ * auVar55._12_4_;
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1438),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1438));
          auVar55 = vsubps_avx512vl(auVar55,auVar160._0_16_);
          auVar65._0_4_ = auVar55._0_4_ * local_1310;
          auVar65._4_4_ = auVar55._4_4_ * fStack_130c;
          auVar65._8_4_ = auVar55._8_4_ * fStack_1308;
          auVar65._12_4_ = auVar55._12_4_ * fStack_1304;
          auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar44 + 0x80 + local_1440),auVar66,
                                    *(undefined1 (*) [16])(uVar44 + 0x20 + local_1440));
          auVar55 = vsubps_avx512vl(auVar55,auVar161._0_16_);
          auVar129._0_4_ = auVar55._0_4_ * local_1320;
          auVar129._4_4_ = auVar55._4_4_ * fStack_131c;
          auVar129._8_4_ = auVar55._8_4_ * fStack_1318;
          auVar129._12_4_ = auVar55._12_4_ * fStack_1314;
          auVar55 = vminps_avx(auVar65,auVar129);
          auVar56._4_4_ = iStack_145c;
          auVar56._0_4_ = local_1460;
          auVar56._8_4_ = iStack_1458;
          auVar56._12_4_ = iStack_1454;
          auVar56 = vminps_avx(auVar56,auVar117);
          auVar55 = vminps_avx(auVar56,auVar55);
          uVar25 = vcmpps_avx512vl(auVar57,auVar55,2);
          bVar52 = (byte)uVar25;
          if (((uint)local_1470 & 7) == 6) {
            uVar25 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [16])(uVar44 + 0xf0),1);
            uVar26 = vcmpps_avx512vl(auVar66,*(undefined1 (*) [16])(uVar44 + 0xe0),0xd);
            bVar52 = (byte)uVar25 & (byte)uVar26 & bVar52;
          }
          local_1408 = CONCAT44((int)(uVar44 >> 0x20),(uint)bVar52);
          local_1260._0_16_ = auVar57;
        }
        if ((local_1470 & 8) == 0) {
          if (local_1408 == 0) {
            iVar43 = 4;
          }
          else {
            uVar48 = local_1470 & 0xfffffffffffffff0;
            lVar28 = 0;
            for (uVar44 = local_1408; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
            {
              lVar28 = lVar28 + 1;
            }
            iVar43 = 0;
            uVar44 = local_1408 - 1 & local_1408;
            local_1470 = *(ulong *)(uVar48 + lVar28 * 8);
            if (uVar44 != 0) {
              uVar53 = *(uint *)(local_1260 + lVar28 * 4);
              lVar28 = 0;
              for (uVar49 = uVar44; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000) {
                lVar28 = lVar28 + 1;
              }
              uVar44 = uVar44 - 1 & uVar44;
              uVar49 = *(ulong *)(uVar48 + lVar28 * 8);
              uVar11 = *(uint *)(local_1260 + lVar28 * 4);
              if (uVar44 == 0) {
                if (uVar53 < uVar11) {
                  *(ulong *)*local_1498 = uVar49;
                  *(uint *)((long)*local_1498 + 8) = uVar11;
                  local_1498 = local_1498 + 1;
                }
                else {
                  *(ulong *)*local_1498 = local_1470;
                  *(uint *)((long)*local_1498 + 8) = uVar53;
                  local_1470 = uVar49;
                  local_1498 = local_1498 + 1;
                }
              }
              else {
                auVar57._8_8_ = 0;
                auVar57._0_8_ = local_1470;
                auVar57 = vpunpcklqdq_avx(auVar57,ZEXT416(uVar53));
                auVar75._8_8_ = 0;
                auVar75._0_8_ = uVar49;
                auVar55 = vpunpcklqdq_avx(auVar75,ZEXT416(uVar11));
                lVar28 = 0;
                for (uVar49 = uVar44; (uVar49 & 1) == 0; uVar49 = uVar49 >> 1 | 0x8000000000000000)
                {
                  lVar28 = lVar28 + 1;
                }
                uVar44 = uVar44 - 1 & uVar44;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = *(ulong *)(uVar48 + lVar28 * 8);
                auVar123 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_1260 + lVar28 * 4)));
                auVar56 = vpshufd_avx(auVar57,0xaa);
                auVar66 = vpshufd_avx(auVar55,0xaa);
                auVar117 = vpshufd_avx(auVar123,0xaa);
                if (uVar44 == 0) {
                  uVar44 = vpcmpgtd_avx512vl(auVar66,auVar56);
                  uVar44 = uVar44 & 0xf;
                  auVar66 = vpblendmd_avx512vl(auVar55,auVar57);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar58._0_4_ = (uint)bVar18 * auVar66._0_4_ | (uint)!bVar18 * auVar56._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar58._4_4_ = (uint)bVar18 * auVar66._4_4_ | (uint)!bVar18 * auVar56._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar58._8_4_ = (uint)bVar18 * auVar66._8_4_ | (uint)!bVar18 * auVar56._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar58._12_4_ = (uint)bVar18 * auVar66._12_4_ | (uint)!bVar18 * auVar56._12_4_;
                  auVar55 = vmovdqa32_avx512vl(auVar55);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar59._0_4_ = (uint)bVar18 * auVar55._0_4_ | (uint)!bVar18 * auVar57._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar59._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar59._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar59._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
                  auVar57 = vpshufd_avx(auVar58,0xaa);
                  uVar44 = vpcmpgtd_avx512vl(auVar117,auVar57);
                  uVar44 = uVar44 & 0xf;
                  auVar55 = vpblendmd_avx512vl(auVar123,auVar58);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
                  local_1470 = CONCAT44((uint)bVar19 * auVar55._4_4_ | (uint)!bVar19 * auVar57._4_4_
                                        ,(uint)bVar18 * auVar55._0_4_ |
                                         (uint)!bVar18 * auVar57._0_4_);
                  auVar57 = vmovdqa32_avx512vl(auVar123);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar60._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * auVar58._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar60._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * auVar58._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar60._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * auVar58._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar60._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * auVar58._12_4_;
                  auVar57 = vpshufd_avx(auVar60,0xaa);
                  auVar55 = vpshufd_avx(auVar59,0xaa);
                  uVar44 = vpcmpgtd_avx512vl(auVar57,auVar55);
                  uVar44 = uVar44 & 0xf;
                  auVar55 = vpblendmd_avx512vl(auVar60,auVar59);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar61._0_4_ = (uint)bVar18 * auVar55._0_4_ | (uint)!bVar18 * auVar57._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar61._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar61._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar61._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
                  auVar57 = vmovdqa32_avx512vl(auVar60);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar62._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * auVar59._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar62._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * auVar59._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar62._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * auVar59._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar62._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * auVar59._12_4_;
                  *local_1498 = auVar62;
                  local_1498[1] = auVar61;
                  local_1498 = local_1498 + 2;
                }
                else {
                  lVar28 = 0;
                  for (; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
                    lVar28 = lVar28 + 1;
                  }
                  uVar53 = *(uint *)(local_1260 + lVar28 * 4);
                  auVar141._8_8_ = 0;
                  auVar141._0_8_ = *(ulong *)(uVar48 + lVar28 * 8);
                  auVar65 = vpunpcklqdq_avx(auVar141,ZEXT416(uVar53));
                  uVar44 = vpcmpgtd_avx512vl(auVar66,auVar56);
                  uVar44 = uVar44 & 0xf;
                  auVar66 = vpblendmd_avx512vl(auVar55,auVar57);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar67._0_4_ = (uint)bVar18 * auVar66._0_4_ | (uint)!bVar18 * auVar56._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar67._4_4_ = (uint)bVar18 * auVar66._4_4_ | (uint)!bVar18 * auVar56._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar67._8_4_ = (uint)bVar18 * auVar66._8_4_ | (uint)!bVar18 * auVar56._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar67._12_4_ = (uint)bVar18 * auVar66._12_4_ | (uint)!bVar18 * auVar56._12_4_;
                  auVar55 = vmovdqa32_avx512vl(auVar55);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar69._0_4_ = (uint)bVar18 * auVar55._0_4_ | (uint)!bVar18 * auVar57._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar69._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar69._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar69._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
                  auVar118._4_4_ = uVar53;
                  auVar118._0_4_ = uVar53;
                  auVar118._8_4_ = uVar53;
                  auVar118._12_4_ = uVar53;
                  uVar44 = vpcmpgtd_avx512vl(auVar118,auVar117);
                  uVar44 = uVar44 & 0xf;
                  auVar57 = vpblendmd_avx512vl(auVar65,auVar123);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar70._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * uVar53;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar70._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * uVar53;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar70._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * uVar53;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar70._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * uVar53;
                  auVar57 = vmovdqa32_avx512vl(auVar65);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar71._0_4_ = (uint)bVar18 * auVar57._0_4_ | (uint)!bVar18 * auVar123._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar71._4_4_ = (uint)bVar18 * auVar57._4_4_ | (uint)!bVar18 * auVar123._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar71._8_4_ = (uint)bVar18 * auVar57._8_4_ | (uint)!bVar18 * auVar123._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar71._12_4_ = (uint)bVar18 * auVar57._12_4_ | (uint)!bVar18 * auVar123._12_4_;
                  auVar144 = ZEXT1664(auVar144._0_16_);
                  auVar57 = vpshufd_avx(auVar71,0xaa);
                  auVar55 = vpshufd_avx(auVar69,0xaa);
                  uVar44 = vpcmpgtd_avx512vl(auVar57,auVar55);
                  uVar44 = uVar44 & 0xf;
                  auVar55 = vpblendmd_avx512vl(auVar71,auVar69);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar72._0_4_ = (uint)bVar18 * auVar55._0_4_ | (uint)!bVar18 * auVar57._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar72._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar72._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar72._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
                  auVar57 = vmovdqa32_avx512vl(auVar71);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar73._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * auVar69._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar73._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * auVar69._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar73._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * auVar69._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar73._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * auVar69._12_4_;
                  auVar57 = vpshufd_avx(auVar70,0xaa);
                  auVar55 = vpshufd_avx(auVar67,0xaa);
                  uVar44 = vpcmpgtd_avx512vl(auVar57,auVar55);
                  uVar44 = uVar44 & 0xf;
                  auVar55 = vpblendmd_avx512vl(auVar70,auVar67);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  bVar19 = (bool)((byte)(uVar44 >> 1) & 1);
                  local_1470 = CONCAT44((uint)bVar19 * auVar55._4_4_ | (uint)!bVar19 * auVar57._4_4_
                                        ,(uint)bVar18 * auVar55._0_4_ |
                                         (uint)!bVar18 * auVar57._0_4_);
                  auVar57 = vmovdqa32_avx512vl(auVar70);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar74._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * auVar67._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar74._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * auVar67._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar74._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * auVar67._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar74._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * auVar67._12_4_;
                  auVar57 = vpshufd_avx(auVar74,0xaa);
                  auVar55 = vpshufd_avx(auVar72,0xaa);
                  uVar44 = vpcmpgtd_avx512vl(auVar55,auVar57);
                  uVar44 = uVar44 & 0xf;
                  auVar55 = vpblendmd_avx512vl(auVar72,auVar74);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar63._0_4_ = (uint)bVar18 * auVar55._0_4_ | (uint)!bVar18 * auVar57._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar63._4_4_ = (uint)bVar18 * auVar55._4_4_ | (uint)!bVar18 * auVar57._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar63._8_4_ = (uint)bVar18 * auVar55._8_4_ | (uint)!bVar18 * auVar57._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar63._12_4_ = (uint)bVar18 * auVar55._12_4_ | (uint)!bVar18 * auVar57._12_4_;
                  auVar57 = vmovdqa32_avx512vl(auVar72);
                  bVar18 = (bool)((byte)uVar44 & 1);
                  auVar64._0_4_ = (uint)bVar18 * auVar57._0_4_ | !bVar18 * auVar74._0_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                  auVar64._4_4_ = (uint)bVar18 * auVar57._4_4_ | !bVar18 * auVar74._4_4_;
                  bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                  auVar64._8_4_ = (uint)bVar18 * auVar57._8_4_ | !bVar18 * auVar74._8_4_;
                  bVar18 = SUB81(uVar44 >> 3,0);
                  auVar64._12_4_ = (uint)bVar18 * auVar57._12_4_ | !bVar18 * auVar74._12_4_;
                  *local_1498 = auVar73;
                  local_1498[1] = auVar64;
                  local_1498[2] = auVar63;
                  local_1498 = local_1498 + 3;
                }
                auVar140 = ZEXT1664(auVar140._0_16_);
              }
            }
          }
        }
        else {
          iVar43 = 6;
        }
      } while (iVar43 == 0);
    } while (iVar43 != 6);
    local_1448 = (ulong)((uint)local_1470 & 0xf) - 8;
    if (local_1448 != 0) {
      local_1470 = local_1470 & 0xfffffffffffffff0;
      local_1410 = 0;
      do {
        local_1490 = local_1410 * 0x90;
        fVar122 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(local_1470 + 0x80 + local_1490)) *
                  *(float *)(local_1470 + 0x84 + local_1490);
        auVar114._8_8_ = 0;
        auVar114._0_8_ = *(ulong *)(local_1470 + 0x20 + local_1490);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = *(ulong *)(local_1470 + 0x24 + local_1490);
        uVar25 = vpcmpub_avx512vl(auVar114,auVar119,2);
        auVar57 = vpmovzxbd_avx(auVar114);
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x44 + local_1490);
        auVar130._4_4_ = uVar7;
        auVar130._0_4_ = uVar7;
        auVar130._8_4_ = uVar7;
        auVar130._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1470 + 0x38 + local_1490);
        auVar135._4_4_ = uVar7;
        auVar135._0_4_ = uVar7;
        auVar135._8_4_ = uVar7;
        auVar135._12_4_ = uVar7;
        auVar55 = vfmadd213ps_fma(auVar57,auVar130,auVar135);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = *(ulong *)(local_1470 + 0x50 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar115);
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x74 + local_1490);
        auVar142._4_4_ = uVar7;
        auVar142._0_4_ = uVar7;
        auVar142._8_4_ = uVar7;
        auVar142._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1470 + 0x68 + local_1490);
        auVar145._4_4_ = uVar7;
        auVar145._0_4_ = uVar7;
        auVar145._8_4_ = uVar7;
        auVar145._12_4_ = uVar7;
        auVar57 = vfmadd213ps_fma(auVar57,auVar142,auVar145);
        auVar110._4_4_ = fVar122;
        auVar110._0_4_ = fVar122;
        auVar110._8_4_ = fVar122;
        auVar110._12_4_ = fVar122;
        auVar57 = vsubps_avx(auVar57,auVar55);
        auVar55 = vfmadd213ps_fma(auVar57,auVar110,auVar55);
        auVar57 = vpmovzxbd_avx(auVar119);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar56 = vfmadd213ps_fma(auVar57,auVar130,auVar135);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = *(ulong *)(local_1470 + 0x54 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar120);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar57 = vfmadd213ps_fma(auVar57,auVar142,auVar145);
        auVar57 = vsubps_avx(auVar57,auVar56);
        auVar56 = vfmadd213ps_fma(auVar57,auVar110,auVar56);
        auVar124._8_8_ = 0;
        auVar124._0_8_ = *(ulong *)(local_1470 + 0x28 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar124);
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x48 + local_1490);
        auVar131._4_4_ = uVar7;
        auVar131._0_4_ = uVar7;
        auVar131._8_4_ = uVar7;
        auVar131._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1470 + 0x3c + local_1490);
        auVar136._4_4_ = uVar7;
        auVar136._0_4_ = uVar7;
        auVar136._8_4_ = uVar7;
        auVar136._12_4_ = uVar7;
        auVar66 = vfmadd213ps_fma(auVar57,auVar131,auVar136);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = *(ulong *)(local_1470 + 0x58 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar143);
        uVar7 = *(undefined4 *)(local_1470 + 0x78 + local_1490);
        auVar146._4_4_ = uVar7;
        auVar146._0_4_ = uVar7;
        auVar146._8_4_ = uVar7;
        auVar146._12_4_ = uVar7;
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x6c + local_1490);
        auVar150._4_4_ = uVar7;
        auVar150._0_4_ = uVar7;
        auVar150._8_4_ = uVar7;
        auVar150._12_4_ = uVar7;
        auVar57 = vfmadd213ps_fma(auVar57,auVar146,auVar150);
        auVar57 = vsubps_avx(auVar57,auVar66);
        auVar66 = vfmadd213ps_fma(auVar57,auVar110,auVar66);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(local_1470 + 0x2c + local_1490);
        auVar57 = vpmovzxbd_avx(auVar125);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar117 = vfmadd213ps_fma(auVar57,auVar131,auVar136);
        auVar152._8_8_ = 0;
        auVar152._0_8_ = *(ulong *)(local_1470 + 0x5c + local_1490);
        auVar57 = vpmovzxbd_avx(auVar152);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar57 = vfmadd213ps_fma(auVar57,auVar146,auVar150);
        auVar57 = vsubps_avx(auVar57,auVar117);
        auVar117 = vfmadd213ps_fma(auVar57,auVar110,auVar117);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)(local_1470 + 0x30 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar126);
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x4c + local_1490);
        auVar137._4_4_ = uVar7;
        auVar137._0_4_ = uVar7;
        auVar137._8_4_ = uVar7;
        auVar137._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1470 + 0x40 + local_1490);
        auVar147._4_4_ = uVar7;
        auVar147._0_4_ = uVar7;
        auVar147._8_4_ = uVar7;
        auVar147._12_4_ = uVar7;
        auVar123 = vfmadd213ps_fma(auVar57,auVar137,auVar147);
        auVar151._8_8_ = 0;
        auVar151._0_8_ = *(ulong *)(local_1470 + 0x60 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar151);
        auVar57 = vcvtdq2ps_avx(auVar57);
        uVar7 = *(undefined4 *)(local_1470 + 0x7c + local_1490);
        auVar153._4_4_ = uVar7;
        auVar153._0_4_ = uVar7;
        auVar153._8_4_ = uVar7;
        auVar153._12_4_ = uVar7;
        uVar7 = *(undefined4 *)(local_1470 + 0x70 + local_1490);
        auVar154._4_4_ = uVar7;
        auVar154._0_4_ = uVar7;
        auVar154._8_4_ = uVar7;
        auVar154._12_4_ = uVar7;
        auVar57 = vfmadd213ps_fma(auVar57,auVar153,auVar154);
        auVar57 = vsubps_avx(auVar57,auVar123);
        auVar123 = vfmadd213ps_fma(auVar57,auVar110,auVar123);
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)(local_1470 + 0x34 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar127);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar65 = vfmadd213ps_fma(auVar57,auVar137,auVar147);
        auVar138._8_8_ = 0;
        auVar138._0_8_ = *(ulong *)(local_1470 + 100 + local_1490);
        auVar57 = vpmovzxbd_avx(auVar138);
        auVar57 = vcvtdq2ps_avx(auVar57);
        auVar57 = vfmadd213ps_fma(auVar57,auVar153,auVar154);
        auVar57 = vsubps_avx(auVar57,auVar65);
        auVar57 = vfmadd213ps_fma(auVar57,auVar110,auVar65);
        auVar55 = vsubps_avx512vl(auVar55,auVar159._0_16_);
        auVar65 = vmulps_avx512vl(auVar162._0_16_,auVar55);
        auVar55 = vsubps_avx512vl(auVar66,auVar160._0_16_);
        auVar66 = vmulps_avx512vl(auVar163._0_16_,auVar55);
        auVar55 = vsubps_avx512vl(auVar123,auVar161._0_16_);
        auVar128._0_4_ = auVar55._0_4_ * (float)local_1340._0_4_;
        auVar128._4_4_ = auVar55._4_4_ * (float)local_1340._4_4_;
        auVar128._8_4_ = auVar55._8_4_ * fStack_1338;
        auVar128._12_4_ = auVar55._12_4_ * fStack_1334;
        auVar55 = vsubps_avx512vl(auVar56,auVar159._0_16_);
        auVar121._0_4_ = auVar55._0_4_ * (float)local_1350._0_4_;
        auVar121._4_4_ = auVar55._4_4_ * (float)local_1350._4_4_;
        auVar121._8_4_ = auVar55._8_4_ * fStack_1348;
        auVar121._12_4_ = auVar55._12_4_ * fStack_1344;
        auVar55 = vsubps_avx512vl(auVar117,auVar160._0_16_);
        auVar132._0_4_ = auVar55._0_4_ * local_1310;
        auVar132._4_4_ = auVar55._4_4_ * fStack_130c;
        auVar132._8_4_ = auVar55._8_4_ * fStack_1308;
        auVar132._12_4_ = auVar55._12_4_ * fStack_1304;
        auVar57 = vsubps_avx512vl(auVar57,auVar161._0_16_);
        auVar139._0_4_ = auVar57._0_4_ * local_1320;
        auVar139._4_4_ = auVar57._4_4_ * fStack_131c;
        auVar139._8_4_ = auVar57._8_4_ * fStack_1318;
        auVar139._12_4_ = auVar57._12_4_ * fStack_1314;
        auVar55 = vpminsd_avx(auVar65,auVar121);
        auVar57 = vpmaxsd_avx(auVar65,auVar121);
        auVar56 = vpminsd_avx(auVar66,auVar132);
        auVar55 = vpmaxsd_avx(auVar55,auVar56);
        auVar56 = vpmaxsd_avx(auVar66,auVar132);
        auVar66 = vpminsd_avx(auVar57,auVar56);
        auVar56 = vpminsd_avx(auVar128,auVar139);
        auVar57 = vpmaxsd_avx(auVar128,auVar139);
        auVar36._4_4_ = iStack_132c;
        auVar36._0_4_ = local_1330;
        auVar36._8_4_ = iStack_1328;
        auVar36._12_4_ = iStack_1324;
        auVar56 = vpmaxsd_avx(auVar56,auVar36);
        local_1270 = vpmaxsd_avx(auVar55,auVar56);
        auVar35._4_4_ = iStack_145c;
        auVar35._0_4_ = local_1460;
        auVar35._8_4_ = iStack_1458;
        auVar35._12_4_ = iStack_1454;
        auVar57 = vpminsd_avx(auVar57,auVar35);
        auVar57 = vpminsd_avx(auVar66,auVar57);
        local_13d8 = vpcmpd_avx512vl(local_1270,auVar57,2);
        local_13d8 = ((byte)uVar25 & 0xf) & local_13d8;
        if ((char)local_13d8 != '\0') {
          local_1490 = local_1490 + local_1470;
          do {
            pRVar41 = local_13f8;
            sVar40 = local_1400;
            lVar28 = 0;
            for (uVar44 = local_13d8; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000)
            {
              lVar28 = lVar28 + 1;
            }
            fVar122 = *(float *)(ray + k * 4 + 0x100);
            if (*(float *)(local_1270 + lVar28 * 4) <= fVar122) {
              uVar9 = *(ushort *)(local_1490 + lVar28 * 8);
              local_1474 = (uint)uVar9;
              uVar10 = *(ushort *)(local_1490 + 2 + lVar28 * 8);
              uVar53 = *(uint *)(local_1490 + 0x88);
              local_1488 = (ulong)uVar53;
              uVar11 = *(uint *)(local_1490 + 4 + lVar28 * 8);
              local_1468 = (ulong)uVar11;
              local_13e0 = context->scene;
              pGVar12 = (local_13e0->geometries).items[local_1488].ptr;
              local_13e8 = *(long *)&pGVar12->field_0x58;
              fVar116 = (pGVar12->time_range).lower;
              auVar100._4_4_ = fVar116;
              auVar100._0_4_ = fVar116;
              auVar100._8_4_ = fVar116;
              auVar100._12_4_ = fVar116;
              auVar100._16_4_ = fVar116;
              auVar100._20_4_ = fVar116;
              auVar100._24_4_ = fVar116;
              auVar100._28_4_ = fVar116;
              fVar54 = pGVar12->fnumTimeSegments;
              auVar100 = vsubps_avx(*(undefined1 (*) [32])(ray + 0xe0),auVar100);
              fVar116 = (pGVar12->time_range).upper - fVar116;
              auVar80._4_4_ = fVar116;
              auVar80._0_4_ = fVar116;
              auVar80._8_4_ = fVar116;
              auVar80._12_4_ = fVar116;
              auVar80._16_4_ = fVar116;
              auVar80._20_4_ = fVar116;
              auVar80._24_4_ = fVar116;
              auVar80._28_4_ = fVar116;
              auVar100 = vdivps_avx(auVar100,auVar80);
              auVar97._4_4_ = fVar54 * auVar100._4_4_;
              auVar97._0_4_ = fVar54 * auVar100._0_4_;
              auVar97._8_4_ = fVar54 * auVar100._8_4_;
              auVar97._12_4_ = fVar54 * auVar100._12_4_;
              auVar97._16_4_ = fVar54 * auVar100._16_4_;
              auVar97._20_4_ = fVar54 * auVar100._20_4_;
              auVar97._24_4_ = fVar54 * auVar100._24_4_;
              auVar97._28_4_ = auVar100._28_4_;
              auVar100 = vroundps_avx(auVar97,1);
              fVar54 = fVar54 + -1.0;
              auVar79._4_4_ = fVar54;
              auVar79._0_4_ = fVar54;
              auVar79._8_4_ = fVar54;
              auVar79._12_4_ = fVar54;
              auVar79._16_4_ = fVar54;
              auVar79._20_4_ = fVar54;
              auVar79._24_4_ = fVar54;
              auVar79._28_4_ = fVar54;
              auVar100 = vminps_avx(auVar100,auVar79);
              auVar100 = vmaxps_avx(auVar100,_DAT_02020f00);
              local_10e0 = vsubps_avx(auVar97,auVar100);
              local_1100 = vcvtps2dq_avx(auVar100);
              local_13f0 = pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_1468;
              local_1478 = local_1474 & 0x7fff;
              local_147c = uVar10 & 0x7fff;
              uVar46 = *(uint *)(local_13e8 + 4 + local_13f0);
              uVar49 = (ulong)uVar46;
              uVar48 = (ulong)(uVar46 * local_147c + *(int *)(local_13e8 + local_13f0) + local_1478)
              ;
              lVar13 = *(long *)&pGVar12[2].numPrimitives;
              lVar50 = (long)*(int *)(local_1100 + k * 4) * 0x38;
              lVar14 = *(long *)(lVar13 + 0x10 + lVar50);
              lVar15 = *(long *)(lVar13 + lVar50);
              auVar57 = *(undefined1 (*) [16])(lVar15 + lVar14 * uVar48);
              lVar16 = *(long *)(lVar13 + 0x48 + lVar50);
              auVar55 = *(undefined1 (*) [16])(lVar15 + (uVar48 + 1) * lVar14);
              lVar28 = uVar48 + uVar49;
              auVar56 = *(undefined1 (*) [16])(lVar15 + lVar28 * lVar14);
              lVar51 = uVar48 + uVar49 + 1;
              auVar66 = *(undefined1 (*) [16])(lVar15 + lVar51 * lVar14);
              uVar44 = (ulong)(-1 < (short)uVar9);
              lVar45 = uVar48 + uVar44 + 1;
              auVar117 = *(undefined1 (*) [16])(lVar15 + lVar45 * lVar14);
              lVar47 = uVar44 + lVar51;
              auVar123 = *(undefined1 (*) [16])(lVar15 + lVar47 * lVar14);
              uVar44 = 0;
              if (-1 < (short)uVar10) {
                uVar44 = uVar49;
              }
              auVar65 = *(undefined1 (*) [16])(lVar15 + (lVar28 + uVar44) * lVar14);
              auVar129 = *(undefined1 (*) [16])(lVar15 + (lVar51 + uVar44) * lVar14);
              auVar75 = *(undefined1 (*) [16])(lVar15 + lVar14 * (uVar44 + lVar47));
              lVar13 = *(long *)(lVar13 + 0x38 + lVar50);
              auVar67 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(local_10e0 + local_1400 * 4)));
              auVar68 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * uVar48),auVar57);
              auVar68 = vfmadd213ps_avx512vl(auVar68,auVar67,auVar57);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * (uVar48 + 1)),auVar55);
              auVar69 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar55);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar28),auVar56);
              auVar70 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar56);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar51),auVar66);
              auVar71 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar66);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar45),auVar117);
              auVar55 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar117);
              auVar57 = vsubps_avx(*(undefined1 (*) [16])(lVar13 + lVar16 * lVar47),auVar123);
              auVar72 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar123);
              auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar28 + uVar44)),
                                        auVar65);
              auVar73 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar65);
              auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + lVar16 * (lVar51 + uVar44)),
                                        auVar129);
              auVar74 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar129);
              auVar57 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar13 + (uVar44 + lVar47) * lVar16),
                                        auVar75);
              auVar75 = vfmadd213ps_avx512vl(auVar57,auVar67,auVar75);
              auVar56 = vunpcklps_avx(auVar69,auVar72);
              auVar57 = vunpckhps_avx(auVar69,auVar72);
              auVar66 = vunpcklps_avx(auVar55,auVar71);
              auVar55 = vunpckhps_avx(auVar55,auVar71);
              auVar117 = vunpcklps_avx(auVar57,auVar55);
              auVar123 = vunpcklps_avx(auVar56,auVar66);
              auVar57 = vunpckhps_avx(auVar56,auVar66);
              auVar66 = vunpcklps_avx(auVar70,auVar74);
              auVar55 = vunpckhps_avx(auVar70,auVar74);
              auVar65 = vunpcklps_avx(auVar71,auVar73);
              auVar56 = vunpckhps_avx(auVar71,auVar73);
              auVar56 = vunpcklps_avx(auVar55,auVar56);
              auVar129 = vunpcklps_avx(auVar66,auVar65);
              auVar55 = vunpckhps_avx(auVar66,auVar65);
              auVar84._16_16_ = auVar74;
              auVar84._0_16_ = auVar70;
              auVar82._16_16_ = auVar72;
              auVar82._0_16_ = auVar69;
              auVar100 = vunpcklps_avx(auVar82,auVar84);
              auVar89._16_16_ = auVar71;
              auVar89._0_16_ = auVar68;
              auVar86._16_16_ = auVar75;
              auVar86._0_16_ = auVar71;
              auVar97 = vunpcklps_avx(auVar89,auVar86);
              auVar79 = vunpcklps_avx(auVar97,auVar100);
              auVar97 = vunpckhps_avx(auVar97,auVar100);
              auVar100 = vunpckhps_avx(auVar82,auVar84);
              auVar80 = vunpckhps_avx(auVar89,auVar86);
              auVar80 = vunpcklps_avx(auVar80,auVar100);
              auVar85._16_16_ = auVar123;
              auVar85._0_16_ = auVar123;
              auVar87._16_16_ = auVar57;
              auVar87._0_16_ = auVar57;
              auVar88._16_16_ = auVar117;
              auVar88._0_16_ = auVar117;
              auVar90._16_16_ = auVar129;
              auVar90._0_16_ = auVar129;
              auVar91._16_16_ = auVar55;
              auVar91._0_16_ = auVar55;
              local_1200 = &local_1499;
              uVar7 = *(undefined4 *)(local_13f8 + local_1400 * 4);
              auVar92._4_4_ = uVar7;
              auVar92._0_4_ = uVar7;
              auVar92._8_4_ = uVar7;
              auVar92._12_4_ = uVar7;
              auVar92._16_4_ = uVar7;
              auVar92._20_4_ = uVar7;
              auVar92._24_4_ = uVar7;
              auVar92._28_4_ = uVar7;
              auVar76 = vbroadcastss_avx512vl
                                  (ZEXT416(*(uint *)(local_13f8 + local_1400 * 4 + 0x20)));
              auVar77 = vbroadcastss_avx512vl
                                  (ZEXT416(*(uint *)(local_13f8 + local_1400 * 4 + 0x40)));
              uVar7 = *(undefined4 *)(local_13f8 + local_1400 * 4 + 0x80);
              auVar149._4_4_ = uVar7;
              auVar149._0_4_ = uVar7;
              auVar149._8_4_ = uVar7;
              auVar149._12_4_ = uVar7;
              auVar149._16_4_ = uVar7;
              auVar149._20_4_ = uVar7;
              auVar149._24_4_ = uVar7;
              auVar149._28_4_ = uVar7;
              auVar78 = vinsertf32x4_avx512vl(ZEXT1632(auVar56),auVar56,1);
              uVar7 = *(undefined4 *)(local_13f8 + local_1400 * 4 + 0xa0);
              auVar155._4_4_ = uVar7;
              auVar155._0_4_ = uVar7;
              auVar155._8_4_ = uVar7;
              auVar155._12_4_ = uVar7;
              auVar155._16_4_ = uVar7;
              auVar155._20_4_ = uVar7;
              auVar155._24_4_ = uVar7;
              auVar155._28_4_ = uVar7;
              fVar116 = *(float *)(local_13f8 + local_1400 * 4 + 0xc0);
              auVar157._4_4_ = fVar116;
              auVar157._0_4_ = fVar116;
              auVar157._8_4_ = fVar116;
              auVar157._12_4_ = fVar116;
              auVar157._16_4_ = fVar116;
              auVar157._20_4_ = fVar116;
              auVar157._24_4_ = fVar116;
              auVar157._28_4_ = fVar116;
              auVar100 = vsubps_avx(auVar79,auVar92);
              auVar79 = vsubps_avx512vl(auVar97,auVar76);
              auVar80 = vsubps_avx512vl(auVar80,auVar77);
              auVar97 = vsubps_avx(auVar85,auVar92);
              auVar81 = vsubps_avx512vl(auVar87,auVar76);
              auVar82 = vsubps_avx512vl(auVar88,auVar77);
              auVar83 = vsubps_avx512vl(auVar90,auVar92);
              auVar76 = vsubps_avx512vl(auVar91,auVar76);
              auVar77 = vsubps_avx512vl(auVar78,auVar77);
              auVar84 = vsubps_avx512vl(auVar83,auVar100);
              auVar85 = vsubps_avx512vl(auVar76,auVar79);
              auVar86 = vsubps_avx512vl(auVar77,auVar80);
              auVar87 = vsubps_avx512vl(auVar100,auVar97);
              auVar88 = vsubps_avx512vl(auVar79,auVar81);
              auVar89 = vsubps_avx512vl(auVar80,auVar82);
              auVar90 = vsubps_avx512vl(auVar97,auVar83);
              auVar91 = vsubps_avx512vl(auVar81,auVar76);
              auVar92 = vsubps_avx512vl(auVar82,auVar77);
              auVar78 = vaddps_avx512vl(auVar83,auVar100);
              auVar93 = vaddps_avx512vl(auVar76,auVar79);
              auVar94 = vaddps_avx512vl(auVar77,auVar80);
              auVar95 = vmulps_avx512vl(auVar93,auVar86);
              auVar95 = vfmsub231ps_avx512vl(auVar95,auVar85,auVar94);
              auVar94 = vmulps_avx512vl(auVar94,auVar84);
              auVar94 = vfmsub231ps_avx512vl(auVar94,auVar86,auVar78);
              auVar78 = vmulps_avx512vl(auVar78,auVar85);
              auVar57 = vfmsub231ps_fma(auVar78,auVar84,auVar93);
              auVar96._0_4_ = auVar57._0_4_ * fVar116;
              auVar96._4_4_ = auVar57._4_4_ * fVar116;
              auVar96._8_4_ = auVar57._8_4_ * fVar116;
              auVar96._12_4_ = auVar57._12_4_ * fVar116;
              auVar96._16_4_ = fVar116 * 0.0;
              auVar96._20_4_ = fVar116 * 0.0;
              auVar96._24_4_ = fVar116 * 0.0;
              auVar96._28_4_ = 0;
              auVar78 = vfmadd231ps_avx512vl(auVar96,auVar155,auVar94);
              auVar94 = vfmadd231ps_avx512vl(auVar78,auVar149,auVar95);
              auVar158._0_4_ = auVar100._0_4_ + auVar97._0_4_;
              auVar158._4_4_ = auVar100._4_4_ + auVar97._4_4_;
              auVar158._8_4_ = auVar100._8_4_ + auVar97._8_4_;
              auVar158._12_4_ = auVar100._12_4_ + auVar97._12_4_;
              auVar158._16_4_ = auVar100._16_4_ + auVar97._16_4_;
              auVar158._20_4_ = auVar100._20_4_ + auVar97._20_4_;
              auVar158._24_4_ = auVar100._24_4_ + auVar97._24_4_;
              auVar158._28_4_ = auVar100._28_4_ + auVar97._28_4_;
              auVar78 = vaddps_avx512vl(auVar79,auVar81);
              auVar93 = vaddps_avx512vl(auVar80,auVar82);
              auVar95 = vmulps_avx512vl(auVar78,auVar89);
              auVar95 = vfmsub231ps_avx512vl(auVar95,auVar88,auVar93);
              auVar93 = vmulps_avx512vl(auVar93,auVar87);
              auVar96 = vfmsub231ps_avx512vl(auVar93,auVar89,auVar158);
              auVar93 = vmulps_avx512vl(auVar158,auVar88);
              auVar78 = vfmsub231ps_avx512vl(auVar93,auVar87,auVar78);
              auVar93._4_4_ = auVar78._4_4_ * fVar116;
              auVar93._0_4_ = auVar78._0_4_ * fVar116;
              auVar93._8_4_ = auVar78._8_4_ * fVar116;
              auVar93._12_4_ = auVar78._12_4_ * fVar116;
              auVar93._16_4_ = auVar78._16_4_ * fVar116;
              auVar93._20_4_ = auVar78._20_4_ * fVar116;
              auVar93._24_4_ = auVar78._24_4_ * fVar116;
              auVar93._28_4_ = auVar78._28_4_;
              auVar78 = vfmadd231ps_avx512vl(auVar93,auVar155,auVar96);
              auVar93 = vfmadd231ps_avx512vl(auVar78,auVar149,auVar95);
              auVar97 = vaddps_avx512vl(auVar97,auVar83);
              auVar76 = vaddps_avx512vl(auVar81,auVar76);
              auVar77 = vaddps_avx512vl(auVar82,auVar77);
              auVar78 = vmulps_avx512vl(auVar76,auVar92);
              auVar78 = vfmsub231ps_avx512vl(auVar78,auVar91,auVar77);
              auVar77 = vmulps_avx512vl(auVar77,auVar90);
              auVar77 = vfmsub231ps_avx512vl(auVar77,auVar92,auVar97);
              auVar81._4_4_ = auVar97._4_4_ * auVar91._4_4_;
              auVar81._0_4_ = auVar97._0_4_ * auVar91._0_4_;
              auVar81._8_4_ = auVar97._8_4_ * auVar91._8_4_;
              auVar81._12_4_ = auVar97._12_4_ * auVar91._12_4_;
              auVar81._16_4_ = auVar97._16_4_ * auVar91._16_4_;
              auVar81._20_4_ = auVar97._20_4_ * auVar91._20_4_;
              auVar81._24_4_ = auVar97._24_4_ * auVar91._24_4_;
              auVar81._28_4_ = auVar97._28_4_;
              auVar57 = vfmsub231ps_fma(auVar81,auVar90,auVar76);
              auVar97 = vmulps_avx512vl(ZEXT1632(auVar57),auVar157);
              auVar97 = vfmadd231ps_avx512vl(auVar97,auVar155,auVar77);
              auVar97 = vfmadd231ps_avx512vl(auVar97,auVar149,auVar78);
              auVar83._0_4_ = auVar94._0_4_ + auVar93._0_4_;
              auVar83._4_4_ = auVar94._4_4_ + auVar93._4_4_;
              auVar83._8_4_ = auVar94._8_4_ + auVar93._8_4_;
              auVar83._12_4_ = auVar94._12_4_ + auVar93._12_4_;
              auVar83._16_4_ = auVar94._16_4_ + auVar93._16_4_;
              auVar83._20_4_ = auVar94._20_4_ + auVar93._20_4_;
              auVar83._24_4_ = auVar94._24_4_ + auVar93._24_4_;
              auVar83._28_4_ = auVar94._28_4_ + auVar93._28_4_;
              local_1220 = vaddps_avx512vl(auVar97,auVar83);
              auVar76._8_4_ = 0x7fffffff;
              auVar76._0_8_ = 0x7fffffff7fffffff;
              auVar76._12_4_ = 0x7fffffff;
              auVar76._16_4_ = 0x7fffffff;
              auVar76._20_4_ = 0x7fffffff;
              auVar76._24_4_ = 0x7fffffff;
              auVar76._28_4_ = 0x7fffffff;
              vandps_avx512vl(local_1220,auVar76);
              auVar77._8_4_ = 0x34000000;
              auVar77._0_8_ = 0x3400000034000000;
              auVar77._12_4_ = 0x34000000;
              auVar77._16_4_ = 0x34000000;
              auVar77._20_4_ = 0x34000000;
              auVar77._24_4_ = 0x34000000;
              auVar77._28_4_ = 0x34000000;
              auVar76 = vmulps_avx512vl(local_1220,auVar77);
              auVar77 = vminps_avx512vl(auVar94,auVar93);
              auVar77 = vminps_avx512vl(auVar77,auVar97);
              auVar78._8_4_ = 0x80000000;
              auVar78._0_8_ = 0x8000000080000000;
              auVar78._12_4_ = 0x80000000;
              auVar78._16_4_ = 0x80000000;
              auVar78._20_4_ = 0x80000000;
              auVar78._24_4_ = 0x80000000;
              auVar78._28_4_ = 0x80000000;
              auVar78 = vxorps_avx512vl(auVar76,auVar78);
              uVar25 = vcmpps_avx512vl(auVar77,auVar78,5);
              auVar77 = vmaxps_avx512vl(auVar94,auVar93);
              auVar97 = vmaxps_avx512vl(auVar77,auVar97);
              uVar26 = vcmpps_avx512vl(auVar97,auVar76,2);
              bVar52 = (byte)uVar25 | (byte)uVar26;
              ray = pRVar41;
              k = sVar40;
              if (bVar52 != 0) {
                auVar97 = vmulps_avx512vl(auVar88,auVar86);
                auVar76 = vmulps_avx512vl(auVar84,auVar89);
                auVar77 = vmulps_avx512vl(auVar87,auVar85);
                auVar78 = vmulps_avx512vl(auVar91,auVar89);
                auVar81 = vmulps_avx512vl(auVar87,auVar92);
                auVar82 = vmulps_avx512vl(auVar90,auVar88);
                auVar83 = vfmsub213ps_avx512vl(auVar85,auVar89,auVar97);
                auVar85 = vfmsub213ps_avx512vl(auVar86,auVar87,auVar76);
                auVar84 = vfmsub213ps_avx512vl(auVar84,auVar88,auVar77);
                auVar86 = vfmsub213ps_avx512vl(auVar92,auVar88,auVar78);
                auVar88 = vfmsub213ps_avx512vl(auVar90,auVar89,auVar81);
                auVar87 = vfmsub213ps_avx512vl(auVar91,auVar87,auVar82);
                auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar97,auVar89);
                vandps_avx512vl(auVar78,auVar89);
                uVar44 = vcmpps_avx512vl(auVar89,auVar89,1);
                vandps_avx512vl(auVar76,auVar89);
                vandps_avx512vl(auVar81,auVar89);
                uVar48 = vcmpps_avx512vl(auVar89,auVar89,1);
                vandps_avx512vl(auVar77,auVar89);
                vandps_avx512vl(auVar82,auVar89);
                uVar49 = vcmpps_avx512vl(auVar89,auVar89,1);
                bVar18 = (bool)((byte)uVar44 & 1);
                auVar98._0_4_ =
                     (float)((uint)bVar18 * auVar83._0_4_ | (uint)!bVar18 * auVar86._0_4_);
                bVar18 = (bool)((byte)(uVar44 >> 1) & 1);
                auVar98._4_4_ =
                     (float)((uint)bVar18 * auVar83._4_4_ | (uint)!bVar18 * auVar86._4_4_);
                bVar18 = (bool)((byte)(uVar44 >> 2) & 1);
                auVar98._8_4_ =
                     (float)((uint)bVar18 * auVar83._8_4_ | (uint)!bVar18 * auVar86._8_4_);
                bVar18 = (bool)((byte)(uVar44 >> 3) & 1);
                auVar98._12_4_ =
                     (float)((uint)bVar18 * auVar83._12_4_ | (uint)!bVar18 * auVar86._12_4_);
                bVar18 = (bool)((byte)(uVar44 >> 4) & 1);
                auVar98._16_4_ =
                     (float)((uint)bVar18 * auVar83._16_4_ | (uint)!bVar18 * auVar86._16_4_);
                bVar18 = (bool)((byte)(uVar44 >> 5) & 1);
                auVar98._20_4_ =
                     (float)((uint)bVar18 * auVar83._20_4_ | (uint)!bVar18 * auVar86._20_4_);
                bVar18 = (bool)((byte)(uVar44 >> 6) & 1);
                auVar98._24_4_ =
                     (float)((uint)bVar18 * auVar83._24_4_ | (uint)!bVar18 * auVar86._24_4_);
                bVar18 = SUB81(uVar44 >> 7,0);
                auVar98._28_4_ = (uint)bVar18 * auVar83._28_4_ | (uint)!bVar18 * auVar86._28_4_;
                bVar18 = (bool)((byte)uVar48 & 1);
                auVar99._0_4_ =
                     (float)((uint)bVar18 * auVar85._0_4_ | (uint)!bVar18 * auVar88._0_4_);
                bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                auVar99._4_4_ =
                     (float)((uint)bVar18 * auVar85._4_4_ | (uint)!bVar18 * auVar88._4_4_);
                bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
                auVar99._8_4_ =
                     (float)((uint)bVar18 * auVar85._8_4_ | (uint)!bVar18 * auVar88._8_4_);
                bVar18 = (bool)((byte)(uVar48 >> 3) & 1);
                auVar99._12_4_ =
                     (float)((uint)bVar18 * auVar85._12_4_ | (uint)!bVar18 * auVar88._12_4_);
                bVar18 = (bool)((byte)(uVar48 >> 4) & 1);
                auVar99._16_4_ =
                     (float)((uint)bVar18 * auVar85._16_4_ | (uint)!bVar18 * auVar88._16_4_);
                bVar18 = (bool)((byte)(uVar48 >> 5) & 1);
                auVar99._20_4_ =
                     (float)((uint)bVar18 * auVar85._20_4_ | (uint)!bVar18 * auVar88._20_4_);
                bVar18 = (bool)((byte)(uVar48 >> 6) & 1);
                auVar99._24_4_ =
                     (float)((uint)bVar18 * auVar85._24_4_ | (uint)!bVar18 * auVar88._24_4_);
                bVar18 = SUB81(uVar48 >> 7,0);
                auVar99._28_4_ = (uint)bVar18 * auVar85._28_4_ | (uint)!bVar18 * auVar88._28_4_;
                bVar18 = (bool)((byte)uVar49 & 1);
                fVar54 = (float)((uint)bVar18 * auVar84._0_4_ | (uint)!bVar18 * auVar87._0_4_);
                bVar18 = (bool)((byte)(uVar49 >> 1) & 1);
                fVar104 = (float)((uint)bVar18 * auVar84._4_4_ | (uint)!bVar18 * auVar87._4_4_);
                bVar18 = (bool)((byte)(uVar49 >> 2) & 1);
                fVar105 = (float)((uint)bVar18 * auVar84._8_4_ | (uint)!bVar18 * auVar87._8_4_);
                bVar18 = (bool)((byte)(uVar49 >> 3) & 1);
                fVar106 = (float)((uint)bVar18 * auVar84._12_4_ | (uint)!bVar18 * auVar87._12_4_);
                bVar18 = (bool)((byte)(uVar49 >> 4) & 1);
                fVar107 = (float)((uint)bVar18 * auVar84._16_4_ | (uint)!bVar18 * auVar87._16_4_);
                bVar18 = (bool)((byte)(uVar49 >> 5) & 1);
                fVar108 = (float)((uint)bVar18 * auVar84._20_4_ | (uint)!bVar18 * auVar87._20_4_);
                bVar18 = (bool)((byte)(uVar49 >> 6) & 1);
                fVar109 = (float)((uint)bVar18 * auVar84._24_4_ | (uint)!bVar18 * auVar87._24_4_);
                bVar18 = SUB81(uVar49 >> 7,0);
                auVar31._4_4_ = fVar116 * fVar104;
                auVar31._0_4_ = fVar116 * fVar54;
                auVar31._8_4_ = fVar116 * fVar105;
                auVar31._12_4_ = fVar116 * fVar106;
                auVar31._16_4_ = fVar116 * fVar107;
                auVar31._20_4_ = fVar116 * fVar108;
                auVar31._24_4_ = fVar116 * fVar109;
                auVar31._28_4_ = fVar116;
                auVar57 = vfmadd213ps_fma(auVar155,auVar99,auVar31);
                auVar57 = vfmadd213ps_fma(auVar149,auVar98,ZEXT1632(auVar57));
                auVar76 = ZEXT1632(CONCAT412(auVar57._12_4_ + auVar57._12_4_,
                                             CONCAT48(auVar57._8_4_ + auVar57._8_4_,
                                                      CONCAT44(auVar57._4_4_ + auVar57._4_4_,
                                                               auVar57._0_4_ + auVar57._0_4_))));
                auVar156._0_4_ = auVar80._0_4_ * fVar54;
                auVar156._4_4_ = auVar80._4_4_ * fVar104;
                auVar156._8_4_ = auVar80._8_4_ * fVar105;
                auVar156._12_4_ = auVar80._12_4_ * fVar106;
                auVar156._16_4_ = auVar80._16_4_ * fVar107;
                auVar156._20_4_ = auVar80._20_4_ * fVar108;
                auVar156._24_4_ = auVar80._24_4_ * fVar109;
                auVar156._28_4_ = 0;
                auVar57 = vfmadd213ps_fma(auVar79,auVar99,auVar156);
                auVar55 = vfmadd213ps_fma(auVar100,auVar98,ZEXT1632(auVar57));
                auVar100 = vrcp14ps_avx512vl(auVar76);
                auVar95._8_4_ = 0x3f800000;
                auVar95._0_8_ = &DAT_3f8000003f800000;
                auVar95._12_4_ = 0x3f800000;
                auVar95._16_4_ = 0x3f800000;
                auVar95._20_4_ = 0x3f800000;
                auVar95._24_4_ = 0x3f800000;
                auVar95._28_4_ = 0x3f800000;
                auVar97 = vfnmadd213ps_avx512vl(auVar100,auVar76,auVar95);
                auVar57 = vfmadd132ps_fma(auVar97,auVar100,auVar100);
                local_1300 = ZEXT1632(CONCAT412(auVar57._12_4_ * (auVar55._12_4_ + auVar55._12_4_),
                                                CONCAT48(auVar57._8_4_ *
                                                         (auVar55._8_4_ + auVar55._8_4_),
                                                         CONCAT44(auVar57._4_4_ *
                                                                  (auVar55._4_4_ + auVar55._4_4_),
                                                                  auVar57._0_4_ *
                                                                  (auVar55._0_4_ + auVar55._0_4_))))
                                     );
                auVar111._4_4_ = fVar122;
                auVar111._0_4_ = fVar122;
                auVar111._8_4_ = fVar122;
                auVar111._12_4_ = fVar122;
                auVar111._16_4_ = fVar122;
                auVar111._20_4_ = fVar122;
                auVar111._24_4_ = fVar122;
                auVar111._28_4_ = fVar122;
                uVar25 = vcmpps_avx512vl(local_1300,auVar111,2);
                uVar7 = *(undefined4 *)(local_13f8 + local_1400 * 4 + 0x60);
                auVar29._4_4_ = uVar7;
                auVar29._0_4_ = uVar7;
                auVar29._8_4_ = uVar7;
                auVar29._12_4_ = uVar7;
                auVar29._16_4_ = uVar7;
                auVar29._20_4_ = uVar7;
                auVar29._24_4_ = uVar7;
                auVar29._28_4_ = uVar7;
                uVar26 = vcmpps_avx512vl(local_1300,auVar29,0xd);
                bVar52 = (byte)uVar25 & (byte)uVar26 & bVar52;
                if (bVar52 != 0) {
                  uVar25 = vcmpps_avx512vl(auVar76,_DAT_02020f00,4);
                  bVar52 = bVar52 & (byte)uVar25;
                  if (bVar52 != 0) {
                    local_1200 = &local_1499;
                    local_11f8 = CONCAT31(local_11f8._1_3_,bVar52);
                    local_11a0 = local_1300;
                    auVar100 = vsubps_avx(local_1220,auVar93);
                    auVar100 = vblendps_avx(auVar94,auVar100,0xf0);
                    auVar97 = vsubps_avx(local_1220,auVar94);
                    auVar97 = vblendps_avx(auVar93,auVar97,0xf0);
                    local_1180[0] = auVar98._0_4_ * 1.0;
                    local_1180[1] = auVar98._4_4_ * 1.0;
                    local_1180[2] = auVar98._8_4_ * 1.0;
                    local_1180[3] = auVar98._12_4_ * 1.0;
                    fStack_1170 = auVar98._16_4_ * -1.0;
                    fStack_116c = auVar98._20_4_ * -1.0;
                    fStack_1168 = auVar98._24_4_ * -1.0;
                    uStack_1164 = auVar98._28_4_;
                    local_1160._4_4_ = auVar99._4_4_ * 1.0;
                    local_1160._0_4_ = auVar99._0_4_ * 1.0;
                    local_1160._8_4_ = auVar99._8_4_ * 1.0;
                    local_1160._12_4_ = auVar99._12_4_ * 1.0;
                    local_1160._16_4_ = auVar99._16_4_ * -1.0;
                    local_1160._20_4_ = auVar99._20_4_ * -1.0;
                    local_1160._24_4_ = auVar99._24_4_ * -1.0;
                    local_1160._28_4_ = auVar99._28_4_;
                    local_1140[0] = fVar54 * 1.0;
                    local_1140[1] = fVar104 * 1.0;
                    local_1140[2] = fVar105 * 1.0;
                    local_1140[3] = fVar106 * 1.0;
                    fStack_1130 = fVar107 * -1.0;
                    fStack_112c = fVar108 * -1.0;
                    fStack_1128 = fVar109 * -1.0;
                    uStack_1124 = (uint)bVar18 * auVar84._28_4_ | (uint)!bVar18 * auVar87._28_4_;
                    auVar79 = vpbroadcastd_avx512vl();
                    auVar79 = vpaddd_avx2(auVar79,_DAT_0205d4c0);
                    auVar76 = vpbroadcastd_avx512vl();
                    auVar76 = vpaddd_avx2(auVar76,_DAT_0205d4e0);
                    auVar133._0_4_ = (float)(int)(*(ushort *)(local_13e8 + 8 + local_13f0) - 1);
                    auVar133._4_12_ = auVar80._4_12_;
                    auVar34._12_4_ = 0;
                    auVar34._0_12_ = ZEXT812(0);
                    auVar55 = vrcp14ss_avx512f(auVar34 << 0x20,ZEXT416((uint)auVar133._0_4_));
                    auVar57 = vfnmadd213ss_fma(auVar133,auVar55,SUB6416(ZEXT464(0x40000000),0));
                    fVar122 = auVar55._0_4_ * auVar57._0_4_;
                    auVar148._0_4_ = (float)(int)(*(ushort *)(local_13e8 + 10 + local_13f0) - 1);
                    auVar148._4_12_ = auVar80._4_12_;
                    auVar55 = vrcp14ss_avx512f(auVar34 << 0x20,ZEXT416((uint)auVar148._0_4_));
                    auVar57 = vfnmadd213ss_fma(auVar148,auVar55,SUB6416(ZEXT464(0x40000000),0));
                    fStack_1228 = auVar55._0_4_ * auVar57._0_4_;
                    auVar80 = vcvtdq2ps_avx(auVar79);
                    fVar108 = auVar80._28_4_ + auVar100._28_4_;
                    fVar116 = (local_1220._0_4_ * auVar80._0_4_ + auVar100._0_4_) * fVar122;
                    fVar54 = (local_1220._4_4_ * auVar80._4_4_ + auVar100._4_4_) * fVar122;
                    local_1260._4_4_ = fVar54;
                    local_1260._0_4_ = fVar116;
                    fVar104 = (local_1220._8_4_ * auVar80._8_4_ + auVar100._8_4_) * fVar122;
                    local_1260._8_4_ = fVar104;
                    fVar105 = (local_1220._12_4_ * auVar80._12_4_ + auVar100._12_4_) * fVar122;
                    local_1260._12_4_ = fVar105;
                    fVar106 = (local_1220._16_4_ * auVar80._16_4_ + auVar100._16_4_) * fVar122;
                    local_1260._16_4_ = fVar106;
                    fVar107 = (local_1220._20_4_ * auVar80._20_4_ + auVar100._20_4_) * fVar122;
                    local_1260._20_4_ = fVar107;
                    fVar122 = (local_1220._24_4_ * auVar80._24_4_ + auVar100._24_4_) * fVar122;
                    local_1260._24_4_ = fVar122;
                    local_1260._28_4_ = fVar108;
                    auVar100 = vcvtdq2ps_avx(auVar76);
                    fStack_1224 = auVar100._28_4_ + auVar97._28_4_;
                    local_1240 = (local_1220._0_4_ * auVar100._0_4_ + auVar97._0_4_) * fStack_1228;
                    fStack_123c = (local_1220._4_4_ * auVar100._4_4_ + auVar97._4_4_) * fStack_1228;
                    fStack_1238 = (local_1220._8_4_ * auVar100._8_4_ + auVar97._8_4_) * fStack_1228;
                    fStack_1234 = (local_1220._12_4_ * auVar100._12_4_ + auVar97._12_4_) *
                                  fStack_1228;
                    fStack_1230 = (local_1220._16_4_ * auVar100._16_4_ + auVar97._16_4_) *
                                  fStack_1228;
                    fStack_122c = (local_1220._20_4_ * auVar100._20_4_ + auVar97._20_4_) *
                                  fStack_1228;
                    fStack_1228 = (local_1220._24_4_ * auVar100._24_4_ + auVar97._24_4_) *
                                  fStack_1228;
                    pGVar12 = (local_13e0->geometries).items[local_1488].ptr;
                    if ((pGVar12->mask & *(uint *)(local_13f8 + local_1400 * 4 + 0x120)) != 0) {
                      auVar94._8_4_ = 0x219392ef;
                      auVar94._0_8_ = 0x219392ef219392ef;
                      auVar94._12_4_ = 0x219392ef;
                      auVar94._16_4_ = 0x219392ef;
                      auVar94._20_4_ = 0x219392ef;
                      auVar94._24_4_ = 0x219392ef;
                      auVar94._28_4_ = 0x219392ef;
                      uVar44 = vcmpps_avx512vl(local_1220,auVar94,5);
                      auVar100 = vrcp14ps_avx512vl(local_1220);
                      auVar134._8_4_ = 0x3f800000;
                      auVar134._0_8_ = &DAT_3f8000003f800000;
                      auVar134._12_4_ = 0x3f800000;
                      auVar134._16_4_ = 0x3f800000;
                      auVar134._20_4_ = 0x3f800000;
                      auVar134._24_4_ = 0x3f800000;
                      auVar134._28_4_ = 0x3f800000;
                      auVar57 = vfnmadd213ps_fma(local_1220,auVar100,auVar134);
                      auVar100 = vfmadd132ps_avx512vl(ZEXT1632(auVar57),auVar100,auVar100);
                      fVar1 = (float)((uint)((byte)uVar44 & 1) * auVar100._0_4_);
                      fVar109 = (float)((uint)((byte)(uVar44 >> 1) & 1) * auVar100._4_4_);
                      fVar2 = (float)((uint)((byte)(uVar44 >> 2) & 1) * auVar100._8_4_);
                      fVar3 = (float)((uint)((byte)(uVar44 >> 3) & 1) * auVar100._12_4_);
                      fVar4 = (float)((uint)((byte)(uVar44 >> 4) & 1) * auVar100._16_4_);
                      fVar5 = (float)((uint)((byte)(uVar44 >> 5) & 1) * auVar100._20_4_);
                      fVar6 = (float)((uint)((byte)(uVar44 >> 6) & 1) * auVar100._24_4_);
                      auVar32._4_4_ = fVar54 * fVar109;
                      auVar32._0_4_ = fVar116 * fVar1;
                      auVar32._8_4_ = fVar104 * fVar2;
                      auVar32._12_4_ = fVar105 * fVar3;
                      auVar32._16_4_ = fVar106 * fVar4;
                      auVar32._20_4_ = fVar107 * fVar5;
                      auVar32._24_4_ = fVar122 * fVar6;
                      auVar32._28_4_ = fVar108;
                      local_11e0 = vminps_avx(auVar32,auVar134);
                      auVar33._4_4_ = fStack_123c * fVar109;
                      auVar33._0_4_ = local_1240 * fVar1;
                      auVar33._8_4_ = fStack_1238 * fVar2;
                      auVar33._12_4_ = fStack_1234 * fVar3;
                      auVar33._16_4_ = fStack_1230 * fVar4;
                      auVar33._20_4_ = fStack_122c * fVar5;
                      auVar33._24_4_ = fStack_1228 * fVar6;
                      auVar33._28_4_ = fStack_1224;
                      local_11c0 = vminps_avx(auVar33,auVar134);
                      auVar140 = ZEXT3264(local_1300);
                      auVar112._8_4_ = 0x7f800000;
                      auVar112._0_8_ = 0x7f8000007f800000;
                      auVar112._12_4_ = 0x7f800000;
                      auVar112._16_4_ = 0x7f800000;
                      auVar112._20_4_ = 0x7f800000;
                      auVar112._24_4_ = 0x7f800000;
                      auVar112._28_4_ = 0x7f800000;
                      auVar100 = vblendmps_avx512vl(auVar112,local_1300);
                      auVar101._0_4_ =
                           (uint)(bVar52 & 1) * auVar100._0_4_ |
                           (uint)!(bool)(bVar52 & 1) * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 1) & 1);
                      auVar101._4_4_ = (uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 2) & 1);
                      auVar101._8_4_ = (uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 3) & 1);
                      auVar101._12_4_ = (uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 4) & 1);
                      auVar101._16_4_ = (uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 5) & 1);
                      auVar101._20_4_ = (uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 6) & 1);
                      auVar101._24_4_ = (uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * 0x7f800000;
                      bVar18 = (bool)((byte)(local_11f8 >> 7) & 1);
                      auVar101._28_4_ = (uint)bVar18 * auVar100._28_4_ | (uint)!bVar18 * 0x7f800000;
                      auVar100 = vshufps_avx(auVar101,auVar101,0xb1);
                      auVar100 = vminps_avx(auVar101,auVar100);
                      auVar97 = vshufpd_avx(auVar100,auVar100,5);
                      auVar100 = vminps_avx(auVar100,auVar97);
                      auVar97 = vpermpd_avx2(auVar100,0x4e);
                      auVar100 = vminps_avx(auVar100,auVar97);
                      uVar25 = vcmpps_avx512vl(auVar101,auVar100,0);
                      bVar52 = (byte)uVar25 & bVar52;
                      uVar46 = (uint)bVar52;
                      if (bVar52 == 0) {
                        uVar46 = local_11f8;
                      }
                      uVar44 = 0;
                      for (uVar48 = (ulong)(uVar46 & 0xff); (uVar48 & 1) == 0;
                          uVar48 = uVar48 >> 1 | 0x8000000000000000) {
                        uVar44 = uVar44 + 1;
                      }
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar12->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar7 = *(undefined4 *)(local_11e0 + uVar44 * 4);
                        uVar8 = *(undefined4 *)(local_11c0 + uVar44 * 4);
                        fVar122 = local_1180[uVar44];
                        fVar116 = local_1140[uVar44 - 8];
                        fVar54 = local_1140[uVar44];
                        *(float *)(local_13f8 + local_1400 * 4 + 0x100) = local_1180[uVar44 - 8];
                        *(float *)(local_13f8 + local_1400 * 4 + 0x180) = fVar122;
                        *(float *)(local_13f8 + local_1400 * 4 + 0x1a0) = fVar116;
                        *(float *)(local_13f8 + local_1400 * 4 + 0x1c0) = fVar54;
                        *(undefined4 *)(local_13f8 + local_1400 * 4 + 0x1e0) = uVar7;
                        *(undefined4 *)(local_13f8 + local_1400 * 4 + 0x200) = uVar8;
                        *(uint *)(local_13f8 + local_1400 * 4 + 0x220) = uVar11;
                        *(uint *)(local_13f8 + local_1400 * 4 + 0x240) = uVar53;
                        *(uint *)(local_13f8 + local_1400 * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(local_13f8 + local_1400 * 4 + 0x280) =
                             context->user->instPrimID[0];
                      }
                      else {
                        local_12c0 = vpbroadcastd_avx512vl();
                        local_12e0 = vpbroadcastd_avx512vl();
                        uVar53 = local_11f8;
                        do {
                          local_1488 = CONCAT44(local_1488._4_4_,
                                                *(undefined4 *)(pRVar41 + sVar40 * 4 + 0x100));
                          uVar7 = *(undefined4 *)(local_11e0 + uVar44 * 4);
                          local_1060._4_4_ = uVar7;
                          local_1060._0_4_ = uVar7;
                          local_1060._8_4_ = uVar7;
                          local_1060._12_4_ = uVar7;
                          local_1060._16_4_ = uVar7;
                          local_1060._20_4_ = uVar7;
                          local_1060._24_4_ = uVar7;
                          local_1060._28_4_ = uVar7;
                          uVar7 = *(undefined4 *)(local_11c0 + uVar44 * 4);
                          local_1040._4_4_ = uVar7;
                          local_1040._0_4_ = uVar7;
                          local_1040._8_4_ = uVar7;
                          local_1040._12_4_ = uVar7;
                          local_1040._16_4_ = uVar7;
                          local_1040._20_4_ = uVar7;
                          local_1040._24_4_ = uVar7;
                          local_1040._28_4_ = uVar7;
                          *(float *)(pRVar41 + sVar40 * 4 + 0x100) = local_1180[uVar44 - 8];
                          local_13d0.context = context->user;
                          local_10c0 = local_1180[uVar44];
                          fVar122 = local_1140[uVar44 - 8];
                          local_10a0._4_4_ = fVar122;
                          local_10a0._0_4_ = fVar122;
                          local_10a0._8_4_ = fVar122;
                          local_10a0._12_4_ = fVar122;
                          local_10a0._16_4_ = fVar122;
                          local_10a0._20_4_ = fVar122;
                          local_10a0._24_4_ = fVar122;
                          local_10a0._28_4_ = fVar122;
                          fVar122 = local_1140[uVar44];
                          local_1080._4_4_ = fVar122;
                          local_1080._0_4_ = fVar122;
                          local_1080._8_4_ = fVar122;
                          local_1080._12_4_ = fVar122;
                          local_1080._16_4_ = fVar122;
                          local_1080._20_4_ = fVar122;
                          local_1080._24_4_ = fVar122;
                          local_1080._28_4_ = fVar122;
                          fStack_10bc = local_10c0;
                          fStack_10b8 = local_10c0;
                          fStack_10b4 = local_10c0;
                          fStack_10b0 = local_10c0;
                          fStack_10ac = local_10c0;
                          fStack_10a8 = local_10c0;
                          fStack_10a4 = local_10c0;
                          local_1020 = local_12e0._0_8_;
                          uStack_1018 = local_12e0._8_8_;
                          uStack_1010 = local_12e0._16_8_;
                          uStack_1008 = local_12e0._24_8_;
                          local_1000 = local_12c0;
                          vpcmpeqd_avx2(local_12c0,local_12c0);
                          uStack_fdc = (local_13d0.context)->instID[0];
                          local_fe0 = uStack_fdc;
                          uStack_fd8 = uStack_fdc;
                          uStack_fd4 = uStack_fdc;
                          uStack_fd0 = uStack_fdc;
                          uStack_fcc = uStack_fdc;
                          uStack_fc8 = uStack_fdc;
                          uStack_fc4 = uStack_fdc;
                          uStack_fbc = (local_13d0.context)->instPrimID[0];
                          local_fc0 = uStack_fbc;
                          uStack_fb8 = uStack_fbc;
                          uStack_fb4 = uStack_fbc;
                          uStack_fb0 = uStack_fbc;
                          uStack_fac = uStack_fbc;
                          uStack_fa8 = uStack_fbc;
                          uStack_fa4 = uStack_fbc;
                          local_12a0 = local_1120._0_8_;
                          uStack_1298 = local_1120._8_8_;
                          uStack_1290 = local_1120._16_8_;
                          uStack_1288 = local_1120._24_8_;
                          local_13d0.valid = (int *)&local_12a0;
                          local_13d0.geometryUserPtr = pGVar12->userPtr;
                          local_13d0.ray = (RTCRayN *)pRVar41;
                          local_13d0.hit = (RTCHitN *)&local_10c0;
                          local_13d0.N = 8;
                          if (pGVar12->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar12->intersectionFilterN)(&local_13d0);
                            auVar140 = ZEXT3264(local_1300);
                            auVar163 = ZEXT1664(local_13a0);
                            auVar162 = ZEXT1664(local_1390);
                            auVar161 = ZEXT1664(local_1380);
                            auVar160 = ZEXT1664(local_1370);
                            auVar159 = ZEXT1664(local_1360);
                          }
                          auVar37._8_8_ = uStack_1298;
                          auVar37._0_8_ = local_12a0;
                          auVar37._16_8_ = uStack_1290;
                          auVar37._24_8_ = uStack_1288;
                          if (auVar37 == (undefined1  [32])0x0) {
LAB_0080822e:
                            *(undefined4 *)(pRVar41 + sVar40 * 4 + 0x100) = (undefined4)local_1488;
                          }
                          else {
                            p_Var17 = context->args->filter;
                            if ((p_Var17 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var17)(&local_13d0);
                              auVar140 = ZEXT3264(local_1300);
                              auVar163 = ZEXT1664(local_13a0);
                              auVar162 = ZEXT1664(local_1390);
                              auVar161 = ZEXT1664(local_1380);
                              auVar160 = ZEXT1664(local_1370);
                              auVar159 = ZEXT1664(local_1360);
                            }
                            auVar38._8_8_ = uStack_1298;
                            auVar38._0_8_ = local_12a0;
                            auVar38._16_8_ = uStack_1290;
                            auVar38._24_8_ = uStack_1288;
                            if (auVar38 == (undefined1  [32])0x0) goto LAB_0080822e;
                            uVar48 = vptestmd_avx512vl(auVar38,auVar38);
                            fVar122 = *(float *)(local_13d0.hit + 4);
                            fVar116 = *(float *)(local_13d0.hit + 8);
                            fVar54 = *(float *)(local_13d0.hit + 0xc);
                            fVar104 = *(float *)(local_13d0.hit + 0x10);
                            fVar105 = *(float *)(local_13d0.hit + 0x14);
                            fVar106 = *(float *)(local_13d0.hit + 0x18);
                            fVar107 = *(float *)(local_13d0.hit + 0x1c);
                            bVar52 = (byte)uVar48;
                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar48 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar48 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar48 >> 6) & 1);
                            bVar24 = SUB81(uVar48 >> 7,0);
                            *(uint *)(local_13d0.ray + 0x180) =
                                 (uint)(bVar52 & 1) * (int)*(float *)local_13d0.hit |
                                 (uint)!(bool)(bVar52 & 1) * *(int *)(local_13d0.ray + 0x180);
                            *(uint *)(local_13d0.ray + 0x184) =
                                 (uint)bVar18 * (int)fVar122 |
                                 (uint)!bVar18 * *(int *)(local_13d0.ray + 0x184);
                            *(uint *)(local_13d0.ray + 0x188) =
                                 (uint)bVar19 * (int)fVar116 |
                                 (uint)!bVar19 * *(int *)(local_13d0.ray + 0x188);
                            *(uint *)(local_13d0.ray + 0x18c) =
                                 (uint)bVar20 * (int)fVar54 |
                                 (uint)!bVar20 * *(int *)(local_13d0.ray + 0x18c);
                            *(uint *)(local_13d0.ray + 400) =
                                 (uint)bVar21 * (int)fVar104 |
                                 (uint)!bVar21 * *(int *)(local_13d0.ray + 400);
                            *(uint *)(local_13d0.ray + 0x194) =
                                 (uint)bVar22 * (int)fVar105 |
                                 (uint)!bVar22 * *(int *)(local_13d0.ray + 0x194);
                            *(uint *)(local_13d0.ray + 0x198) =
                                 (uint)bVar23 * (int)fVar106 |
                                 (uint)!bVar23 * *(int *)(local_13d0.ray + 0x198);
                            *(uint *)(local_13d0.ray + 0x19c) =
                                 (uint)bVar24 * (int)fVar107 |
                                 (uint)!bVar24 * *(int *)(local_13d0.ray + 0x19c);
                            fVar122 = *(float *)(local_13d0.hit + 0x24);
                            fVar116 = *(float *)(local_13d0.hit + 0x28);
                            fVar54 = *(float *)(local_13d0.hit + 0x2c);
                            fVar104 = *(float *)(local_13d0.hit + 0x30);
                            fVar105 = *(float *)(local_13d0.hit + 0x34);
                            fVar106 = *(float *)(local_13d0.hit + 0x38);
                            fVar107 = *(float *)(local_13d0.hit + 0x3c);
                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar48 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar48 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar48 >> 6) & 1);
                            bVar24 = SUB81(uVar48 >> 7,0);
                            *(uint *)(local_13d0.ray + 0x1a0) =
                                 (uint)(bVar52 & 1) * (int)*(float *)(local_13d0.hit + 0x20) |
                                 (uint)!(bool)(bVar52 & 1) * *(int *)(local_13d0.ray + 0x1a0);
                            *(uint *)(local_13d0.ray + 0x1a4) =
                                 (uint)bVar18 * (int)fVar122 |
                                 (uint)!bVar18 * *(int *)(local_13d0.ray + 0x1a4);
                            *(uint *)(local_13d0.ray + 0x1a8) =
                                 (uint)bVar19 * (int)fVar116 |
                                 (uint)!bVar19 * *(int *)(local_13d0.ray + 0x1a8);
                            *(uint *)(local_13d0.ray + 0x1ac) =
                                 (uint)bVar20 * (int)fVar54 |
                                 (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1ac);
                            *(uint *)(local_13d0.ray + 0x1b0) =
                                 (uint)bVar21 * (int)fVar104 |
                                 (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1b0);
                            *(uint *)(local_13d0.ray + 0x1b4) =
                                 (uint)bVar22 * (int)fVar105 |
                                 (uint)!bVar22 * *(int *)(local_13d0.ray + 0x1b4);
                            *(uint *)(local_13d0.ray + 0x1b8) =
                                 (uint)bVar23 * (int)fVar106 |
                                 (uint)!bVar23 * *(int *)(local_13d0.ray + 0x1b8);
                            *(uint *)(local_13d0.ray + 0x1bc) =
                                 (uint)bVar24 * (int)fVar107 |
                                 (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1bc);
                            fVar122 = *(float *)(local_13d0.hit + 0x44);
                            fVar116 = *(float *)(local_13d0.hit + 0x48);
                            fVar54 = *(float *)(local_13d0.hit + 0x4c);
                            fVar104 = *(float *)(local_13d0.hit + 0x50);
                            fVar105 = *(float *)(local_13d0.hit + 0x54);
                            fVar106 = *(float *)(local_13d0.hit + 0x58);
                            fVar107 = *(float *)(local_13d0.hit + 0x5c);
                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar48 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar48 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar48 >> 6) & 1);
                            bVar24 = SUB81(uVar48 >> 7,0);
                            *(uint *)(local_13d0.ray + 0x1c0) =
                                 (uint)(bVar52 & 1) * (int)*(float *)(local_13d0.hit + 0x40) |
                                 (uint)!(bool)(bVar52 & 1) * *(int *)(local_13d0.ray + 0x1c0);
                            *(uint *)(local_13d0.ray + 0x1c4) =
                                 (uint)bVar18 * (int)fVar122 |
                                 (uint)!bVar18 * *(int *)(local_13d0.ray + 0x1c4);
                            *(uint *)(local_13d0.ray + 0x1c8) =
                                 (uint)bVar19 * (int)fVar116 |
                                 (uint)!bVar19 * *(int *)(local_13d0.ray + 0x1c8);
                            *(uint *)(local_13d0.ray + 0x1cc) =
                                 (uint)bVar20 * (int)fVar54 |
                                 (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1cc);
                            *(uint *)(local_13d0.ray + 0x1d0) =
                                 (uint)bVar21 * (int)fVar104 |
                                 (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1d0);
                            *(uint *)(local_13d0.ray + 0x1d4) =
                                 (uint)bVar22 * (int)fVar105 |
                                 (uint)!bVar22 * *(int *)(local_13d0.ray + 0x1d4);
                            *(uint *)(local_13d0.ray + 0x1d8) =
                                 (uint)bVar23 * (int)fVar106 |
                                 (uint)!bVar23 * *(int *)(local_13d0.ray + 0x1d8);
                            *(uint *)(local_13d0.ray + 0x1dc) =
                                 (uint)bVar24 * (int)fVar107 |
                                 (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1dc);
                            fVar122 = *(float *)(local_13d0.hit + 100);
                            fVar116 = *(float *)(local_13d0.hit + 0x68);
                            fVar54 = *(float *)(local_13d0.hit + 0x6c);
                            fVar104 = *(float *)(local_13d0.hit + 0x70);
                            fVar105 = *(float *)(local_13d0.hit + 0x74);
                            fVar106 = *(float *)(local_13d0.hit + 0x78);
                            fVar107 = *(float *)(local_13d0.hit + 0x7c);
                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                            bVar19 = (bool)((byte)(uVar48 >> 2) & 1);
                            bVar20 = (bool)((byte)(uVar48 >> 3) & 1);
                            bVar21 = (bool)((byte)(uVar48 >> 4) & 1);
                            bVar22 = (bool)((byte)(uVar48 >> 5) & 1);
                            bVar23 = (bool)((byte)(uVar48 >> 6) & 1);
                            bVar24 = SUB81(uVar48 >> 7,0);
                            *(uint *)(local_13d0.ray + 0x1e0) =
                                 (uint)(bVar52 & 1) * (int)*(float *)(local_13d0.hit + 0x60) |
                                 (uint)!(bool)(bVar52 & 1) * *(int *)(local_13d0.ray + 0x1e0);
                            *(uint *)(local_13d0.ray + 0x1e4) =
                                 (uint)bVar18 * (int)fVar122 |
                                 (uint)!bVar18 * *(int *)(local_13d0.ray + 0x1e4);
                            *(uint *)(local_13d0.ray + 0x1e8) =
                                 (uint)bVar19 * (int)fVar116 |
                                 (uint)!bVar19 * *(int *)(local_13d0.ray + 0x1e8);
                            *(uint *)(local_13d0.ray + 0x1ec) =
                                 (uint)bVar20 * (int)fVar54 |
                                 (uint)!bVar20 * *(int *)(local_13d0.ray + 0x1ec);
                            *(uint *)(local_13d0.ray + 0x1f0) =
                                 (uint)bVar21 * (int)fVar104 |
                                 (uint)!bVar21 * *(int *)(local_13d0.ray + 0x1f0);
                            *(uint *)(local_13d0.ray + 500) =
                                 (uint)bVar22 * (int)fVar105 |
                                 (uint)!bVar22 * *(int *)(local_13d0.ray + 500);
                            *(uint *)(local_13d0.ray + 0x1f8) =
                                 (uint)bVar23 * (int)fVar106 |
                                 (uint)!bVar23 * *(int *)(local_13d0.ray + 0x1f8);
                            *(uint *)(local_13d0.ray + 0x1fc) =
                                 (uint)bVar24 * (int)fVar107 |
                                 (uint)!bVar24 * *(int *)(local_13d0.ray + 0x1fc);
                            auVar100 = *(undefined1 (*) [32])(local_13d0.ray + 0x200);
                            auVar102._0_4_ =
                                 (uint)(bVar52 & 1) * (int)*(float *)(local_13d0.hit + 0x80) |
                                 (uint)!(bool)(bVar52 & 1) * auVar100._0_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 1) & 1);
                            auVar102._4_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x84) |
                                 (uint)!bVar18 * auVar100._4_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 2) & 1);
                            auVar102._8_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x88) |
                                 (uint)!bVar18 * auVar100._8_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 3) & 1);
                            auVar102._12_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x8c) |
                                 (uint)!bVar18 * auVar100._12_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 4) & 1);
                            auVar102._16_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x90) |
                                 (uint)!bVar18 * auVar100._16_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 5) & 1);
                            auVar102._20_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x94) |
                                 (uint)!bVar18 * auVar100._20_4_;
                            bVar18 = (bool)((byte)(uVar48 >> 6) & 1);
                            auVar102._24_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x98) |
                                 (uint)!bVar18 * auVar100._24_4_;
                            bVar18 = SUB81(uVar48 >> 7,0);
                            auVar102._28_4_ =
                                 (uint)bVar18 * (int)*(float *)(local_13d0.hit + 0x9c) |
                                 (uint)!bVar18 * auVar100._28_4_;
                            *(undefined1 (*) [32])(local_13d0.ray + 0x200) = auVar102;
                            auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_13d0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_13d0.ray + 0x220) = auVar100;
                            auVar100 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_13d0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_13d0.ray + 0x240) = auVar100;
                            auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_13d0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_13d0.ray + 0x260) = auVar100;
                            auVar100 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_13d0.hit + 0x100));
                            *(undefined1 (*) [32])(local_13d0.ray + 0x280) = auVar100;
                          }
                          bVar27 = ~(byte)(1 << ((uint)uVar44 & 0x1f)) & (byte)uVar53;
                          uVar7 = *(undefined4 *)(pRVar41 + sVar40 * 4 + 0x100);
                          auVar30._4_4_ = uVar7;
                          auVar30._0_4_ = uVar7;
                          auVar30._8_4_ = uVar7;
                          auVar30._12_4_ = uVar7;
                          auVar30._16_4_ = uVar7;
                          auVar30._20_4_ = uVar7;
                          auVar30._24_4_ = uVar7;
                          auVar30._28_4_ = uVar7;
                          uVar25 = vcmpps_avx512vl(auVar140._0_32_,auVar30,2);
                          bVar52 = bVar27 & (byte)uVar25;
                          uVar53 = (uint)bVar52;
                          if ((bVar27 & (byte)uVar25) != 0) {
                            auVar113._8_4_ = 0x7f800000;
                            auVar113._0_8_ = 0x7f8000007f800000;
                            auVar113._12_4_ = 0x7f800000;
                            auVar113._16_4_ = 0x7f800000;
                            auVar113._20_4_ = 0x7f800000;
                            auVar113._24_4_ = 0x7f800000;
                            auVar113._28_4_ = 0x7f800000;
                            auVar100 = vblendmps_avx512vl(auVar113,auVar140._0_32_);
                            auVar103._0_4_ =
                                 (uint)(bVar52 & 1) * auVar100._0_4_ |
                                 (uint)!(bool)(bVar52 & 1) * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 1 & 1);
                            auVar103._4_4_ =
                                 (uint)bVar18 * auVar100._4_4_ | (uint)!bVar18 * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 2 & 1);
                            auVar103._8_4_ =
                                 (uint)bVar18 * auVar100._8_4_ | (uint)!bVar18 * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 3 & 1);
                            auVar103._12_4_ =
                                 (uint)bVar18 * auVar100._12_4_ | (uint)!bVar18 * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 4 & 1);
                            auVar103._16_4_ =
                                 (uint)bVar18 * auVar100._16_4_ | (uint)!bVar18 * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 5 & 1);
                            auVar103._20_4_ =
                                 (uint)bVar18 * auVar100._20_4_ | (uint)!bVar18 * 0x7f800000;
                            bVar18 = (bool)(bVar52 >> 6 & 1);
                            auVar103._24_4_ =
                                 (uint)bVar18 * auVar100._24_4_ | (uint)!bVar18 * 0x7f800000;
                            auVar103._28_4_ =
                                 (uint)(bVar52 >> 7) * auVar100._28_4_ |
                                 (uint)!(bool)(bVar52 >> 7) * 0x7f800000;
                            auVar100 = vshufps_avx(auVar103,auVar103,0xb1);
                            auVar100 = vminps_avx(auVar103,auVar100);
                            auVar97 = vshufpd_avx(auVar100,auVar100,5);
                            auVar100 = vminps_avx(auVar100,auVar97);
                            auVar97 = vpermpd_avx2(auVar100,0x4e);
                            auVar100 = vminps_avx(auVar100,auVar97);
                            uVar25 = vcmpps_avx512vl(auVar103,auVar100,0);
                            bVar42 = (byte)uVar25 & bVar52;
                            bVar27 = bVar52;
                            if (bVar42 != 0) {
                              bVar27 = bVar42;
                            }
                            uVar11 = 0;
                            for (uVar46 = (uint)bVar27; (uVar46 & 1) == 0;
                                uVar46 = uVar46 >> 1 | 0x80000000) {
                              uVar11 = uVar11 + 1;
                            }
                            uVar44 = (ulong)uVar11;
                          }
                        } while (bVar52 != 0);
                      }
                    }
                  }
                }
              }
            }
            local_13d8 = local_13d8 - 1 & local_13d8;
          } while (local_13d8 != 0);
        }
        local_1410 = local_1410 + 1;
      } while (local_1410 != local_1448);
    }
    iStack_1454 = *(int *)(ray + k * 4 + 0x100);
    auVar144 = ZEXT1664(_local_1340);
    auVar140 = ZEXT1664(_local_1350);
    iStack_1458 = iStack_1454;
    iStack_145c = iStack_1454;
    local_1460 = iStack_1454;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }